

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::
PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::addHandler
          (PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
           *this,function<void_(const_(anonymous_namespace)::Foo_&)> *handler)

{
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> **pppVar1;
  qsizetype *pqVar2;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> **pppVar3;
  undefined8 *puVar4;
  QObject *pQVar5;
  Data *pDVar6;
  long lVar7;
  _Manager_type p_Var8;
  undefined8 uVar9;
  type ppVar10;
  long lVar11;
  QObject *pQVar12;
  Data *pDVar13;
  long lVar14;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *ppVar15;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
  *old;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *ppVar16;
  type ppVar17;
  ulong uVar18;
  type ppVar19;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *ppVar20;
  type __p;
  type ppVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  QWriteLocker lock;
  _Manager_type local_88;
  _Invoker_type p_Stack_80;
  undefined1 local_78 [32];
  _Any_data local_58;
  Data *local_48;
  QObject *pQStack_40;
  type local_38;
  
  QReadWriteLock::lockForWrite();
  auVar22 = QThread::currentThread();
  pQVar12 = auVar22._0_8_;
  if (pQVar12 == (QObject *)0x0) {
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar22._8_8_;
    auVar23 = auVar23 << 0x40;
  }
  else {
    auVar23 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar12);
  }
  ppVar16 = auVar23._8_8_;
  pDVar13 = auVar23._0_8_;
  local_88 = (_Manager_type)0x0;
  p_Stack_80 = (_Invoker_type)0x0;
  local_78._0_8_ = (Data *)0x0;
  pQVar5 = (QObject *)handler->_M_invoker;
  pDVar6 = (Data *)(handler->super__Function_base)._M_manager;
  if (pDVar6 != (Data *)0x0) {
    local_88 = *(_Manager_type *)&(handler->super__Function_base)._M_functor;
    p_Stack_80 = *(_Invoker_type *)((long)&(handler->super__Function_base)._M_functor + 8);
    (handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    handler->_M_invoker = (_Invoker_type)0x0;
    local_78._0_8_ = pDVar6;
  }
  old = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
         *)(this->m_handlers).d.d;
  lVar7 = (this->m_handlers).d.size;
  local_78._8_8_ = pQVar5;
  if ((old != (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
               *)0x0) &&
     (ppVar16 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)
                (ulong)*(uint *)&old->d, (int)*(uint *)&old->d < 2)) {
    ppVar16 = (this->m_handlers).d.ptr;
    ppVar20 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)
              ((ulong)((long)&old->size + 7U) & 0xfffffffffffffff8);
    if ((long)old->ptr - lVar7 == ((long)ppVar16 - (long)ppVar20 >> 4) * -0x5555555555555555) {
      if ((lVar7 != 0) || (ppVar20 == ppVar16)) goto LAB_0011922f;
      ppVar16[-1].first.wp.d = pDVar13;
      ppVar16[-1].first.wp.value = pQVar12;
      *(undefined8 *)&ppVar16[-1].second.super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&ppVar16[-1].second.super__Function_base._M_functor + 8) = 0;
      ppVar16[-1].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar16[-1].second._M_invoker = (_Invoker_type)pQVar5;
      if ((Data *)local_78._0_8_ != (Data *)0x0) {
        *(_Manager_type *)&ppVar16[-1].second.super__Function_base._M_functor = local_88;
        *(_Invoker_type *)((long)&ppVar16[-1].second.super__Function_base._M_functor + 8) =
             p_Stack_80;
        ppVar16[-1].second.super__Function_base._M_manager = (_Manager_type)local_78._0_8_;
        local_78._0_8_ = (Data *)0x0;
        local_78._8_8_ = (QObject *)0x0;
      }
      pppVar1 = &(this->m_handlers).d.ptr;
      *pppVar1 = *pppVar1 + -1;
    }
    else {
      ppVar16[lVar7].first.wp.d = pDVar13;
      ppVar16[lVar7].first.wp.value = pQVar12;
      *(undefined8 *)&ppVar16[lVar7].second.super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&ppVar16[lVar7].second.super__Function_base._M_functor + 8) = 0;
      ppVar16[lVar7].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar16[lVar7].second._M_invoker = (_Invoker_type)pQVar5;
      if ((Data *)local_78._0_8_ != (Data *)0x0) {
        *(_Manager_type *)&ppVar16[lVar7].second.super__Function_base._M_functor = local_88;
        *(_Invoker_type *)((long)&ppVar16[lVar7].second.super__Function_base._M_functor + 8) =
             p_Stack_80;
        ppVar16[lVar7].second.super__Function_base._M_manager = (_Manager_type)local_78._0_8_;
        local_78._0_8_ = (Data *)0x0;
        local_78._8_8_ = (QObject *)0x0;
      }
    }
    pqVar2 = &(this->m_handlers).d.size;
    *pqVar2 = *pqVar2 + 1;
    goto LAB_0011951b;
  }
LAB_0011922f:
  local_58._M_unused._M_object = (_Manager_type)0x0;
  local_58._8_8_ = (_Invoker_type)0x0;
  local_48 = (Data *)0x0;
  if ((Data *)local_78._0_8_ != (Data *)0x0) {
    ppVar16 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)local_78;
    local_58._M_unused._M_object = local_88;
    local_58._8_8_ = p_Stack_80;
    local_48 = (Data *)local_78._0_8_;
    local_78._0_8_ = (Data *)0x0;
    local_78._8_8_ = (QObject *)0x0;
  }
  local_78._16_8_ = pDVar13;
  local_78._24_8_ = pQVar12;
  pQStack_40 = pQVar5;
  if ((old == (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
               *)0x0) || (1 < *(int *)&old->d)) {
LAB_00119280:
    QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
    ::reallocateAndGrow((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                         *)&this->m_handlers,GrowsAtEnd,(qsizetype)ppVar16,old);
  }
  else {
    uVar18 = (ulong)((long)&old->size + 7U) & 0xfffffffffffffff8;
    if ((long)old->ptr +
        (((long)((long)(this->m_handlers).d.ptr - uVar18) >> 4) * 0x5555555555555555 - lVar7) < 1) {
      __p = (type)(this->m_handlers).d.ptr;
      ppVar16 = (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)
                ((long)__p - uVar18);
      if (((long)ppVar16 < 1) ||
         (pppVar3 = &old->ptr,
         old = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                *)((long)*pppVar3 * 2),
         SBORROW8(lVar7 * 3,(long)old) == lVar7 * 3 + (long)*pppVar3 * -2 < 0)) goto LAB_00119280;
      lVar14 = ((long)ppVar16 >> 4) * -0x10;
      ppVar19 = (type)((long)__p + lVar14);
      if (__p != (type)0x0 && lVar7 != 0) {
        ppVar17 = ppVar19 + lVar7;
        ppVar21 = __p;
        ppVar10 = ppVar17;
        if (__p < ppVar17) {
          ppVar21 = ppVar17;
          ppVar10 = __p;
        }
        local_38 = ppVar19;
        ppVar15 = ppVar19;
        if (ppVar10 != ppVar19) {
          lVar11 = ((long)ppVar16 >> 4) * -0x10;
          do {
            (((type)((long)__p + lVar11))->first).wp.d = (__p->first).wp.d;
            *(QObject **)((long)__p + lVar11 + 8) = (__p->first).wp.value;
            (__p->first).wp.d = (Data *)0x0;
            (__p->first).wp.value = (QObject *)0x0;
            puVar4 = (undefined8 *)((long)__p + lVar11 + 0x10);
            *puVar4 = 0;
            puVar4[1] = 0;
            *(undefined8 *)((long)__p + lVar11 + 0x20) = 0;
            *(_Invoker_type *)((long)__p + lVar11 + 0x28) = (__p->second)._M_invoker;
            if ((__p->second).super__Function_base._M_manager != (_Manager_type)0x0) {
              uVar9 = *(undefined8 *)((long)&(__p->second).super__Function_base._M_functor + 8);
              *(undefined8 *)((long)__p + lVar11 + 0x10) =
                   *(undefined8 *)&(__p->second).super__Function_base._M_functor;
              *(undefined8 *)((long)__p + lVar11 + 0x18) = uVar9;
              *(_Manager_type *)((long)__p + lVar11 + 0x20) =
                   (__p->second).super__Function_base._M_manager;
              (__p->second).super__Function_base._M_manager = (_Manager_type)0x0;
              (__p->second)._M_invoker = (_Invoker_type)0x0;
            }
            ppVar19 = (type)((long)__p + lVar11 + 0x30);
            __p = __p + 1;
          } while (ppVar19 != ppVar10);
          ppVar15 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>
                     *)(lVar14 + (long)__p);
        }
        for (; ppVar15 != ppVar17; ppVar15 = ppVar15 + 1) {
          std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::
          operator=(ppVar15,__p);
          __p = __p + 1;
        }
        while (ppVar19 = local_38, __p != ppVar21) {
          p_Var8 = __p[-1].second.super__Function_base._M_manager;
          if (p_Var8 != (_Manager_type)0x0) {
            (*p_Var8)((_Any_data *)&__p[-1].second,(_Any_data *)&__p[-1].second,__destroy_functor);
          }
          __p = __p + -1;
          pDVar6 = (__p->first).wp.d;
          if (pDVar6 != (Data *)0x0) {
            LOCK();
            *(int *)pDVar6 = *(int *)pDVar6 + -1;
            UNLOCK();
            if ((*(int *)pDVar6 == 0) && (pDVar6 = (__p->first).wp.d, pDVar6 != (Data *)0x0)) {
              operator_delete(pDVar6);
            }
          }
        }
      }
      (this->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)ppVar19;
    }
  }
  ppVar20 = (this->m_handlers).d.ptr;
  lVar14 = (this->m_handlers).d.size;
  ppVar16 = ppVar20 + lVar14;
  lVar11 = -(lVar14 - lVar7);
  if (lVar14 - lVar7 < 1) {
    (ppVar16->first).wp.d = (Data *)local_78._16_8_;
    (ppVar16->first).wp.value = (QObject *)local_78._24_8_;
    local_78._16_8_ = (Data *)0x0;
    local_78._24_8_ = (QObject *)0x0;
    *(undefined8 *)&(ppVar16->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(ppVar16->second).super__Function_base._M_functor + 8) = 0;
    (ppVar16->second).super__Function_base._M_manager = (_Manager_type)0x0;
    (ppVar16->second)._M_invoker = (_Invoker_type)pQStack_40;
    if (local_48 != (Data *)0x0) {
      *(void **)&(ppVar16->second).super__Function_base._M_functor = local_58._M_unused._M_object;
      *(undefined8 *)((long)&(ppVar16->second).super__Function_base._M_functor + 8) = local_58._8_8_
      ;
      (ppVar16->second).super__Function_base._M_manager = (_Manager_type)local_48;
      local_48 = (Data *)0x0;
      pQStack_40 = (QObject *)0x0;
    }
  }
  else {
    pQVar12 = ppVar16[-1].first.wp.value;
    (ppVar16->first).wp.d = ppVar16[-1].first.wp.d;
    (ppVar16->first).wp.value = pQVar12;
    (((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *)
     (ppVar20 + lVar14 + -1))->first).wp.d = (Data *)0x0;
    ppVar20[lVar14 + -1].first.wp.value = (QObject *)0x0;
    *(undefined8 *)&(ppVar16->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(ppVar16->second).super__Function_base._M_functor + 8) = 0;
    (ppVar16->second).super__Function_base._M_manager = (_Manager_type)0x0;
    p_Var8 = ppVar16[-1].second.super__Function_base._M_manager;
    (ppVar16->second)._M_invoker = ppVar16[-1].second._M_invoker;
    if (p_Var8 != (_Manager_type)0x0) {
      uVar9 = *(undefined8 *)((long)&ppVar16[-1].second.super__Function_base._M_functor + 8);
      *(undefined8 *)&(ppVar16->second).super__Function_base._M_functor =
           *(undefined8 *)&ppVar16[-1].second.super__Function_base._M_functor;
      *(undefined8 *)((long)&(ppVar16->second).super__Function_base._M_functor + 8) = uVar9;
      (ppVar16->second).super__Function_base._M_manager = p_Var8;
      ppVar16[-1].second.super__Function_base._M_manager = (_Manager_type)0x0;
      ppVar16[-1].second._M_invoker = (_Invoker_type)0x0;
    }
    ppVar15 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *)
              (ppVar20 + lVar14 + -1);
    while (lVar11 = lVar11 + 1, lVar11 != 0) {
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::
      operator=(ppVar15,ppVar15 + -1);
      ppVar15 = ppVar15 + -1;
    }
    std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::
    operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *)
              (ppVar20 + lVar7),(type)(local_78 + 0x10));
  }
  (this->m_handlers).d.ptr = ppVar20;
  (this->m_handlers).d.size = lVar14 + 1;
  if (local_48 != (Data *)0x0) {
    (*(code *)local_48)(&local_58,&local_58,3);
  }
  if ((Data *)local_78._16_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_78._16_8_ = *(int *)local_78._16_8_ + -1;
    UNLOCK();
    if ((*(int *)local_78._16_8_ == 0) && ((Data *)local_78._16_8_ != (Data *)0x0)) {
      operator_delete((void *)local_78._16_8_);
    }
  }
LAB_0011951b:
  if ((Data *)local_78._0_8_ != (Data *)0x0) {
    (*(code *)local_78._0_8_)(&local_88,&local_88,3);
  }
  QReadWriteLock::unlock();
  return;
}

Assistant:

void addHandler(std::function<F> handler)
    {
        QWriteLocker lock{&m_lock};
        m_handlers.append({QThread::currentThread(), std::move(handler)});
    }